

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O3

bool __thiscall
poplar::
compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::add_child(compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            *this,uint64_t *node_id,uint64_t symb)

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong quo;
  uint64_t cnt;
  uint64_t dsp;
  bool bVar10;
  
  uVar6 = bijective_hash::split_mix_hasher::hash
                    (&this->hasher_,
                     *node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb);
  dsp = 1;
  quo = uVar6 >> ((ulong)(byte)(this->capa_size_).bits_ & 0x3f);
  uVar6 = uVar6 & (this->capa_size_).mask_;
  do {
    if (uVar6 != 0) {
      uVar1 = (this->table_).width_;
      puVar2 = (this->table_).chunks_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = uVar1 * uVar6;
      uVar9 = (ulong)((uint)uVar8 & 0x3f);
      uVar7 = puVar2[uVar8 >> 6];
      if (uVar1 + uVar9 < 0x41) {
        uVar5 = (uint)(uVar7 >> uVar9);
      }
      else {
        bVar3 = (byte)uVar8 & 0x3f;
        uVar5 = (uint)(uVar7 >> bVar3) | (uint)(puVar2[(uVar8 >> 6) + 1] << 0x40 - bVar3);
      }
      bVar10 = (uVar5 & (uint)(this->table_).mask_ & 7) == 0;
      if (bVar10) {
        if (this->size_ == this->max_size_) {
          return false;
        }
        update_slot_(this,uVar6,quo,dsp);
        this->size_ = this->size_ + 1;
LAB_00134004:
        *node_id = uVar6;
        return bVar10;
      }
      bVar4 = compare_dsp_(this,uVar6,dsp);
      if (bVar4) {
        uVar1 = (this->table_).width_;
        puVar2 = (this->table_).chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = uVar1 * uVar6;
        uVar9 = (ulong)((uint)uVar8 & 0x3f);
        uVar7 = puVar2[uVar8 >> 6];
        if (uVar1 + uVar9 < 0x41) {
          uVar7 = uVar7 >> uVar9;
        }
        else {
          bVar3 = (byte)uVar8 & 0x3f;
          uVar7 = uVar7 >> bVar3 | puVar2[(uVar8 >> 6) + 1] << 0x40 - bVar3;
        }
        if (quo == (uVar7 & (this->table_).mask_) >> 3) goto LAB_00134004;
      }
    }
    uVar6 = uVar6 + 1 & (this->capa_size_).mask_;
    dsp = dsp + 1;
  } while( true );
}

Assistant:

bool add_child(uint64_t& node_id, uint64_t symb) {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        auto [quo, mod] = decompose_(hasher_.hash(make_key_(node_id, symb)));

        for (uint64_t i = mod, cnt = 1;; i = right_(i), ++cnt) {
            // because the root's dsp value is zero though it is defined
            if (i == get_root()) {
                continue;
            }

            if (compare_dsp_(i, 0)) {
                // this slot is empty
                if (size_ == max_size_) {
                    return false;  // needs to expand
                }

                update_slot_(i, quo, cnt);

                ++size_;
                node_id = i;

                return true;
            }

            if (compare_dsp_(i, cnt) and quo == get_quo_(i)) {
                node_id = i;
                return false;  // already stored
            }
        }
    }